

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O0

void do_strike_of_virtue(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  OBJ_DATA *pOVar2;
  undefined8 in_RSI;
  CHAR_DATA *in_RDI;
  CHAR_DATA *ch_00;
  CHAR_DATA *unaff_retaddr;
  CHAR_DATA *victim;
  OBJ_DATA *weapon;
  int in_stack_000000a4;
  bool in_stack_000000ab;
  int in_stack_000000ac;
  CHAR_DATA *in_stack_000000b0;
  int in_stack_000000cc;
  CHAR_DATA *in_stack_000000d0;
  int in_stack_000000dc;
  bool in_stack_000000e2;
  bool in_stack_000000e3;
  int in_stack_000000e4;
  CHAR_DATA *in_stack_000000e8;
  CHAR_DATA *in_stack_000000f0;
  int in_stack_00000110;
  char *in_stack_00000118;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  CHAR_DATA *ch_01;
  
  ch_01 = in_RDI->fighting;
  pOVar2 = get_eq_char(in_RDI,0x10);
  if (in_RDI->position == 7) {
    if (pOVar2 == (OBJ_DATA *)0x0) {
      send_to_char((char *)ch_01,in_stack_ffffffffffffffd8);
    }
    else {
      iVar1 = get_skill(in_stack_000000d0,in_stack_000000cc);
      ch_00 = (CHAR_DATA *)((double)iVar1 * 0.85);
      iVar1 = number_percent();
      if ((double)ch_00 <= (double)iVar1) {
        act((char *)ch_01,ch_00,in_stack_ffffffffffffffd0,
            (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        iVar1 = (int)((ulong)ch_00 >> 0x20);
        damage(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
               (int)((ulong)pOVar2 >> 0x20),SUB81((ulong)pOVar2 >> 0x18,0));
        check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,in_stack_000000a4);
      }
      else {
        act((char *)ch_01,ch_00,in_stack_ffffffffffffffd0,
            (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        act((char *)ch_01,ch_00,in_stack_ffffffffffffffd0,
            (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        iVar1 = (int)((ulong)ch_00 >> 0x20);
        one_hit_new(in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,in_stack_000000e3,
                    in_stack_000000e2,in_stack_000000dc,in_stack_00000110,in_stack_00000118);
        check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,in_stack_000000a4);
      }
      WAIT_STATE(ch_01,iVar1);
    }
  }
  else {
    send_to_char((char *)ch_01,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void do_strike_of_virtue(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *weapon;
	CHAR_DATA *victim = ch->fighting;

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (ch->position != POS_FIGHTING)
	{
		send_to_char("You must be fighting to perform this maneuver.\n\r", ch);
		return;
	}

	if (weapon == nullptr)
	{
		send_to_char("You must be wielding a weapon.\n\r", ch);
		return;
	}

	if (get_skill(ch, gsn_strike_of_virtue) * .85 > number_percent())
	{
		act("$n brings $s $p around for a particularly brutal blow!", ch, weapon, 0, TO_ROOM);
		act("You deliver a brutal blow to $N!", ch, 0, victim, TO_CHAR);

		one_hit_new(ch, victim, gsn_strike_of_virtue, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 125, nullptr);
		check_improve(ch, gsn_strike_of_virtue, true, 1);
	}
	else
	{
		act("You swing hard, but fail to connect with your opponent.", ch, 0, 0, TO_CHAR);
		damage(ch, victim, 0, gsn_strike_of_virtue, DAM_NONE, true);
		check_improve(ch, gsn_strike_of_virtue, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}